

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O2

int tcreate(lua_State *L)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = luaL_checkinteger(L,1);
  uVar2 = luaL_optinteger(L,2,0);
  if ((uVar1 & 0xffffffff80000000) != 0) {
    luaL_argerror(L,1,"out of range");
  }
  if (0x7fffffff < uVar2) {
    luaL_argerror(L,2,"out of range");
  }
  lua_createtable(L,(int)uVar1,(int)uVar2);
  return 1;
}

Assistant:

static int tcreate (lua_State *L) {
  lua_Unsigned sizeseq = (lua_Unsigned)luaL_checkinteger(L, 1);
  lua_Unsigned sizerest = (lua_Unsigned)luaL_optinteger(L, 2, 0);
  luaL_argcheck(L, sizeseq <= cast_uint(INT_MAX), 1, "out of range");
  luaL_argcheck(L, sizerest <= cast_uint(INT_MAX), 2, "out of range");
  lua_createtable(L, cast_int(sizeseq), cast_int(sizerest));
  return 1;
}